

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_25095d::NewExpr::printLeft(NewExpr *this,OutputStream *S)

{
  StringView R;
  StringView R_00;
  StringView R_01;
  StringView R_02;
  StringView R_03;
  StringView R_04;
  StringView R_05;
  
  if (this->IsGlobal == true) {
    R.Last = "";
    R.First = "::operator ";
    OutputStream::operator+=(S,R);
  }
  R_00.Last = "";
  R_00.First = "new";
  OutputStream::operator+=(S,R_00);
  if (this->IsArray == true) {
    R_01.Last = "";
    R_01.First = "[]";
    OutputStream::operator+=(S,R_01);
  }
  OutputStream::operator+=(S,' ');
  if ((this->ExprList).NumElements != 0) {
    R_02.Last = "";
    R_02.First = "(";
    OutputStream::operator+=(S,R_02);
    NodeArray::printWithComma(&this->ExprList,S);
    R_03.Last = "";
    R_03.First = ")";
    OutputStream::operator+=(S,R_03);
  }
  Node::print(this->Type,S);
  if ((this->InitList).NumElements != 0) {
    R_04.Last = "";
    R_04.First = "(";
    OutputStream::operator+=(S,R_04);
    NodeArray::printWithComma(&this->InitList,S);
    R_05.Last = "";
    R_05.First = ")";
    OutputStream::operator+=(S,R_05);
    return;
  }
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (IsGlobal)
      S += "::operator ";
    S += "new";
    if (IsArray)
      S += "[]";
    S += ' ';
    if (!ExprList.empty()) {
      S += "(";
      ExprList.printWithComma(S);
      S += ")";
    }
    Type->print(S);
    if (!InitList.empty()) {
      S += "(";
      InitList.printWithComma(S);
      S += ")";
    }

  }